

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

_Bool arena_ralloc_no_move
                (tsdn_t *tsdn,void *ptr,size_t oldsize,size_t size,size_t extra,_Bool zero,
                size_t *newsize)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  arena_t *arena;
  ulong uVar5;
  undefined8 uVar6;
  _Bool _Var7;
  uint uVar8;
  szind_t sVar9;
  arena_tdata_t *paVar10;
  ulong uVar11;
  size_t usize_min;
  ulong uVar12;
  long lVar13;
  rtree_ctx_t *ctx;
  size_t usize_max;
  rtree_leaf_elm_t *prVar14;
  extent_t *extent;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar11 = (ulong)ptr & 0xffffffffc0000000;
  uVar12 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  uVar12 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  if (uVar12 == uVar11) {
    prVar14 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar11) {
    prVar14 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar12;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar11;
    puVar1[1] = (ulong)prVar14;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar14->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    lVar13 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar13 + -8) == uVar11) {
        uVar5 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar13);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar13 + -0x18);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar13 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(ulong *)((long)ctx->cache + lVar13 + -0x18) = uVar12;
        *(ulong *)((long)(ctx->cache + -1) + lVar13) = puVar1[1];
        *puVar1 = uVar11;
        puVar1[1] = uVar5;
        prVar14 = (rtree_leaf_elm_t *)(((uint)ptr >> 9 & 0x1ffff8) + uVar5);
        goto LAB_0010ece8;
      }
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x188);
    prVar14 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,ctx,(uintptr_t)ptr,true,false);
  }
LAB_0010ece8:
  extent = (extent_t *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  _Var7 = true;
  if (0x7000000000000000 < size) goto LAB_0010ee34;
  if (size < 0x1001) {
    usize_min = sz_index2size_tab[sz_size2index_tab[size + 7 >> 3]];
  }
  else {
    uVar12 = size * 2 - 1;
    lVar13 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    uVar12 = ~(-1L << ((char)lVar13 - 3U & 0x3f));
    if ((uint)lVar13 < 7) {
      uVar12 = 0xf;
    }
    usize_min = ~uVar12 & uVar12 + size;
  }
  uVar12 = extra + size;
  if (uVar12 < 0x1001) {
    usize_max = sz_index2size_tab[sz_size2index_tab[uVar12 + 7 >> 3]];
LAB_0010ed76:
    if ((0x3800 < oldsize) || (0x3800 < usize_min)) {
      if ((0x3fff < oldsize) && (0x3fff < usize_max)) {
        _Var7 = large_ralloc_no_move(tsdn,extent,usize_min,usize_max,zero);
      }
      goto LAB_0010ee34;
    }
    if (usize_max < 0x3801) {
      if (usize_max < 0x1001) goto LAB_0010eda6;
      sVar9 = sz_size2index_compute(usize_max);
      goto LAB_0010edb9;
    }
LAB_0010eddd:
    _Var7 = true;
    if ((oldsize < size) || (usize_max < oldsize)) goto LAB_0010ee34;
  }
  else {
    if (uVar12 < 0x7000000000000001) {
      uVar11 = uVar12 * 2 - 1;
      lVar13 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      uVar11 = ~(-1L << ((char)lVar13 - 3U & 0x3f));
      if ((uint)lVar13 < 7) {
        uVar11 = 0xf;
      }
      usize_max = ~uVar11 & uVar12 + uVar11;
      goto LAB_0010ed76;
    }
    if ((0x3800 < oldsize) || (0x3800 < usize_min)) {
      _Var7 = true;
      goto LAB_0010ee34;
    }
    usize_max = 0;
LAB_0010eda6:
    sVar9 = (szind_t)sz_size2index_tab[usize_max + 7 >> 3];
LAB_0010edb9:
    if (oldsize < 0x1001) {
      uVar8 = (uint)sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar8 = sz_size2index_compute(oldsize);
    }
    if (sVar9 != uVar8) goto LAB_0010eddd;
  }
  arena = (arena_t *)arenas[(uint)extent->e_bits & 0xfff].repr;
  if (tsdn != (tsdn_t *)0x0) {
    uVar8 = arena->base->ind;
    paVar10 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata;
    if ((paVar10 == (arena_tdata_t *)0x0) ||
       ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata <= uVar8)) {
      paVar10 = arena_tdata_get_hard(&tsdn->tsd,uVar8);
    }
    else {
      paVar10 = paVar10 + uVar8;
    }
    if ((paVar10 != (arena_tdata_t *)0x0) &&
       (iVar4 = (paVar10->decay_ticker).tick, (paVar10->decay_ticker).tick = iVar4 + -1, iVar4 < 1))
    {
      (paVar10->decay_ticker).tick = (paVar10->decay_ticker).nticks;
      arena_decay(tsdn,arena,false,false);
      _Var7 = false;
      goto LAB_0010ee34;
    }
  }
  _Var7 = false;
LAB_0010ee34:
  *newsize = *(size_t *)((long)sz_index2size_tab + (ulong)((uint)extent->e_bits >> 0xf & 0x7f8));
  return _Var7;
}

Assistant:

bool
arena_ralloc_no_move(tsdn_t *tsdn, void *ptr, size_t oldsize, size_t size,
    size_t extra, bool zero, size_t *newsize) {
	bool ret;
	/* Calls with non-zero extra had to clamp extra. */
	assert(extra == 0 || size + extra <= SC_LARGE_MAXCLASS);

	extent_t *extent = iealloc(tsdn, ptr);
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto done;
	}

	size_t usize_min = sz_s2u(size);
	size_t usize_max = sz_s2u(size + extra);
	if (likely(oldsize <= SC_SMALL_MAXCLASS && usize_min
	    <= SC_SMALL_MAXCLASS)) {
		/*
		 * Avoid moving the allocation if the size class can be left the
		 * same.
		 */
		assert(bin_infos[sz_size2index(oldsize)].reg_size ==
		    oldsize);
		if ((usize_max > SC_SMALL_MAXCLASS
		    || sz_size2index(usize_max) != sz_size2index(oldsize))
		    && (size > oldsize || usize_max < oldsize)) {
			ret = true;
			goto done;
		}

		arena_decay_tick(tsdn, extent_arena_get(extent));
		ret = false;
	} else if (oldsize >= SC_LARGE_MINCLASS
	    && usize_max >= SC_LARGE_MINCLASS) {
		ret = large_ralloc_no_move(tsdn, extent, usize_min, usize_max,
		    zero);
	} else {
		ret = true;
	}
done:
	assert(extent == iealloc(tsdn, ptr));
	*newsize = extent_usize_get(extent);

	return ret;
}